

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InversionTypesSectionParser.cpp
# Opt level: O0

void __thiscall
OpenMD::InversionTypesSectionParser::parseLine
          (InversionTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  uint in_ECX;
  OpenMDException *e;
  string remainder;
  string at4;
  string at3;
  string at2;
  string at1;
  int nTokens;
  InversionType *inversionType;
  InversionTypeParser itParser;
  StringTokenizer tokenizer;
  StringTokenizer *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  string *in_stack_fffffffffffffe70;
  string *in_stack_fffffffffffffe78;
  StringTokenizer *in_stack_fffffffffffffe80;
  string *in_stack_fffffffffffffe88;
  string *in_stack_fffffffffffffe90;
  string *in_stack_fffffffffffffe98;
  ForceField *in_stack_fffffffffffffea0;
  StringTokenizer *in_stack_fffffffffffffea8;
  string local_150 [32];
  string local_130 [24];
  StringTokenizer *in_stack_fffffffffffffee8;
  string local_110 [32];
  undefined4 local_f0;
  int local_ec;
  StringTokenizer *local_e8;
  allocator<char> local_99;
  string local_98 [40];
  InversionTypeParser *in_stack_ffffffffffffff90;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_fffffffffffffe80->tokenString_,(char *)in_stack_fffffffffffffe78,
             (allocator<char> *)in_stack_fffffffffffffe70);
  StringTokenizer::StringTokenizer
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  InversionTypeParser::InversionTypeParser(in_stack_ffffffffffffff90);
  local_e8 = (StringTokenizer *)0x0;
  local_ec = StringTokenizer::countTokens
                       ((StringTokenizer *)
                        CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  if (local_ec < 5) {
    snprintf(painCave.errMsg,2000,
             "InversionTypesSectionParser Error: Not enough tokens at line %d\n",(ulong)in_ECX);
    painCave.isFatal = 1;
    simError();
    local_f0 = 1;
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(in_stack_fffffffffffffee8);
    StringTokenizer::nextToken_abi_cxx11_(in_stack_fffffffffffffee8);
    StringTokenizer::nextToken_abi_cxx11_(in_stack_fffffffffffffee8);
    StringTokenizer::nextToken_abi_cxx11_(in_stack_fffffffffffffee8);
    StringTokenizer::getRemainingString_abi_cxx11_(in_stack_fffffffffffffea8);
    in_stack_fffffffffffffe40 =
         (StringTokenizer *)
         InversionTypeParser::parseLine
                   ((InversionTypeParser *)
                    itParser.stringToEnumMap_._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,
                    (string *)itParser.stringToEnumMap_._M_t._M_impl._0_8_);
    local_e8 = in_stack_fffffffffffffe40;
    if (in_stack_fffffffffffffe40 != (StringTokenizer *)0x0) {
      ForceField::addInversionType
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                 in_stack_fffffffffffffe88,&in_stack_fffffffffffffe80->tokenString_,
                 (InversionType *)in_stack_fffffffffffffe78);
    }
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe70);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe90);
    std::__cxx11::string::~string(local_150);
    std::__cxx11::string::~string(local_130);
    std::__cxx11::string::~string(local_110);
    local_f0 = 0;
  }
  InversionTypeParser::~InversionTypeParser((InversionTypeParser *)0x294cfd);
  StringTokenizer::~StringTokenizer(in_stack_fffffffffffffe40);
  return;
}

Assistant:

void InversionTypesSectionParser::parseLine(ForceField& ff,
                                              const std::string& line,
                                              int lineNo) {
    StringTokenizer tokenizer(line);
    InversionTypeParser itParser;
    InversionType* inversionType = NULL;

    int nTokens = tokenizer.countTokens();

    if (nTokens < 5) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "InversionTypesSectionParser Error: Not enough tokens at line %d\n",
          lineNo);
      painCave.isFatal = 1;
      simError();
      return;
    }

    std::string at1       = tokenizer.nextToken();
    std::string at2       = tokenizer.nextToken();
    std::string at3       = tokenizer.nextToken();
    std::string at4       = tokenizer.nextToken();
    std::string remainder = tokenizer.getRemainingString();

    try {
      inversionType = itParser.parseLine(remainder);
    } catch (OpenMDException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "InversionTypesSectionParser Error: %s "
               "at line %d\n",
               e.what(), lineNo);
      painCave.isFatal = 1;
      simError();
    }

    if (inversionType != NULL) {
      ff.addInversionType(at1, at2, at3, at4, inversionType);
    }
  }